

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int iVar1;
  
  if (_stdout == (FILE *)0x0) {
LAB_001081d9:
    error_tty_suffix = "";
    error_tty_prefix = "";
    stdout_in_tty = 0;
  }
  else {
    iVar1 = fileno(_stdout);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_001081d9;
  }
  if (_stderr != (FILE *)0x0) {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 != 0) goto LAB_00108231;
  }
  stderr_in_tty = 0;
LAB_00108231:
  stdin_copy = dup(0);
  return in_EAX;
}

Assistant:

void init() {
    if (!stdout || !isatty(fileno(stdout))) { /* not a tty, disable colors */
        error_tty_prefix = error_tty_suffix = "\0";
        stdout_in_tty = 0;
    }
    if (!stderr || !isatty(fileno(stderr)))
        stderr_in_tty = 0;
    stdin_copy = dup(STDIN_FILENO);
#if YYDEBUG == 1
    yydebug = 1;
#endif
}